

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16781328,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  undefined4 uVar6;
  uint uVar7;
  uint uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  byte bVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 (*pauVar32) [16];
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 (*pauVar40) [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar58 [64];
  undefined1 in_ZMM12 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  vint8 bi;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  float local_2520;
  float fStack_251c;
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  undefined4 local_2500;
  undefined4 uStack_24fc;
  undefined4 uStack_24f8;
  undefined4 uStack_24f4;
  undefined4 uStack_24f0;
  undefined4 uStack_24ec;
  undefined4 uStack_24e8;
  undefined4 uStack_24e4;
  undefined4 local_24e0;
  undefined4 uStack_24dc;
  undefined4 uStack_24d8;
  undefined4 uStack_24d4;
  undefined4 uStack_24d0;
  undefined4 uStack_24cc;
  undefined4 uStack_24c8;
  undefined4 uStack_24c4;
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  float fStack_24a4;
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  undefined1 auVar57 [64];
  undefined1 auVar59 [64];
  undefined1 auVar62 [64];
  
  pauVar40 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  local_2480 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_24a0 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_24c0 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_24e0 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uStack_24dc = local_24e0;
  uStack_24d8 = local_24e0;
  uStack_24d4 = local_24e0;
  uStack_24d0 = local_24e0;
  uStack_24cc = local_24e0;
  uStack_24c8 = local_24e0;
  uStack_24c4 = local_24e0;
  local_2500 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  uStack_24fc = local_2500;
  uStack_24f8 = local_2500;
  uStack_24f4 = local_2500;
  uStack_24f0 = local_2500;
  uStack_24ec = local_2500;
  uStack_24e8 = local_2500;
  uStack_24e4 = local_2500;
  local_2520 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fStack_251c = local_2520;
  fStack_2518 = local_2520;
  fStack_2514 = local_2520;
  fStack_2510 = local_2520;
  fStack_250c = local_2520;
  fStack_2508 = local_2520;
  fStack_2504 = local_2520;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_2560._4_4_ = fVar2;
  local_2560._0_4_ = fVar2;
  local_2560._8_4_ = fVar2;
  local_2560._12_4_ = fVar2;
  local_2560._16_4_ = fVar2;
  local_2560._20_4_ = fVar2;
  local_2560._24_4_ = fVar2;
  local_2560._28_4_ = fVar2;
  auVar51 = ZEXT3264(local_2560);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_2580._4_4_ = fVar3;
  local_2580._0_4_ = fVar3;
  local_2580._8_4_ = fVar3;
  local_2580._12_4_ = fVar3;
  local_2580._16_4_ = fVar3;
  local_2580._20_4_ = fVar3;
  local_2580._24_4_ = fVar3;
  local_2580._28_4_ = fVar3;
  auVar52 = ZEXT3264(local_2580);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_25a0._4_4_ = fVar4;
  local_25a0._0_4_ = fVar4;
  local_25a0._8_4_ = fVar4;
  local_25a0._12_4_ = fVar4;
  local_25a0._16_4_ = fVar4;
  local_25a0._20_4_ = fVar4;
  local_25a0._24_4_ = fVar4;
  local_25a0._28_4_ = fVar4;
  auVar53 = ZEXT3264(local_25a0);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar5 = (tray->tnear).field_0.i[k];
  local_25c0._4_4_ = iVar5;
  local_25c0._0_4_ = iVar5;
  local_25c0._8_4_ = iVar5;
  local_25c0._12_4_ = iVar5;
  local_25c0._16_4_ = iVar5;
  local_25c0._20_4_ = iVar5;
  local_25c0._24_4_ = iVar5;
  local_25c0._28_4_ = iVar5;
  auVar56 = ZEXT3264(local_25c0);
  iVar5 = (tray->tfar).field_0.i[k];
  auVar41 = ZEXT3264(CONCAT428(iVar5,CONCAT424(iVar5,CONCAT420(iVar5,CONCAT416(iVar5,CONCAT412(iVar5
                                                  ,CONCAT48(iVar5,CONCAT44(iVar5,iVar5))))))));
  fStack_247c = local_2480;
  fStack_2478 = local_2480;
  fStack_2474 = local_2480;
  fStack_2470 = local_2480;
  fStack_246c = local_2480;
  fStack_2468 = local_2480;
  fStack_2464 = local_2480;
  auVar58._0_4_ = fVar2 * -local_2480;
  auVar58._4_4_ = fVar2 * -local_2480;
  auVar58._8_4_ = fVar2 * -local_2480;
  auVar58._12_4_ = fVar2 * -local_2480;
  auVar58._16_4_ = fVar2 * -local_2480;
  auVar58._20_4_ = fVar2 * -local_2480;
  auVar58._28_36_ = in_ZMM11._28_36_;
  auVar58._24_4_ = fVar2 * -local_2480;
  auVar57 = ZEXT3264(auVar58._0_32_);
  fStack_249c = local_24a0;
  fStack_2498 = local_24a0;
  fStack_2494 = local_24a0;
  fStack_2490 = local_24a0;
  fStack_248c = local_24a0;
  fStack_2488 = local_24a0;
  fStack_2484 = local_24a0;
  auVar60._0_4_ = fVar3 * -local_24a0;
  auVar60._4_4_ = fVar3 * -local_24a0;
  auVar60._8_4_ = fVar3 * -local_24a0;
  auVar60._12_4_ = fVar3 * -local_24a0;
  auVar60._16_4_ = fVar3 * -local_24a0;
  auVar60._20_4_ = fVar3 * -local_24a0;
  auVar60._28_36_ = in_ZMM12._28_36_;
  auVar60._24_4_ = fVar3 * -local_24a0;
  auVar59 = ZEXT3264(auVar60._0_32_);
  fStack_24bc = local_24c0;
  fStack_24b8 = local_24c0;
  fStack_24b4 = local_24c0;
  fStack_24b0 = local_24c0;
  fStack_24ac = local_24c0;
  fStack_24a8 = local_24c0;
  fStack_24a4 = local_24c0;
  auVar63._0_4_ = fVar4 * -local_24c0;
  auVar63._4_4_ = fVar4 * -local_24c0;
  auVar63._8_4_ = fVar4 * -local_24c0;
  auVar63._12_4_ = fVar4 * -local_24c0;
  auVar63._16_4_ = fVar4 * -local_24c0;
  auVar63._20_4_ = fVar4 * -local_24c0;
  auVar63._28_36_ = in_ZMM13._28_36_;
  auVar63._24_4_ = fVar4 * -local_24c0;
  auVar62 = ZEXT3264(auVar63._0_32_);
  local_25e0 = auVar58._0_32_;
  local_2600 = auVar60._0_32_;
  local_2620 = auVar63._0_32_;
LAB_01684b5a:
  do {
    do {
      if (pauVar40 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar32 = pauVar40 + -1;
      pauVar40 = pauVar40 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar32 + 8));
    uVar33 = *(ulong *)*pauVar40;
    while ((uVar33 & 8) == 0) {
      fVar2 = *(float *)(ray + k * 4 + 0x70);
      uVar29 = (uint)uVar33 & 7;
      uVar37 = uVar33 & 0xfffffffffffffff0;
      if (uVar29 == 3) {
        local_2400 = *(undefined1 (*) [32])(uVar37 + 0x40);
        local_23c0 = *(undefined1 (*) [32])(uVar37 + 0x60);
        pauVar1 = (undefined1 (*) [32])(uVar37 + 0x80);
        local_2540 = *(undefined8 *)*pauVar1;
        uStack_2538 = *(undefined8 *)(uVar37 + 0x88);
        uStack_2530 = *(undefined8 *)(uVar37 + 0x90);
        uStack_2528 = *(undefined8 *)(uVar37 + 0x98);
        local_2420 = *(undefined1 (*) [32])(uVar37 + 0xa0);
        local_23e0 = *(undefined1 (*) [32])(uVar37 + 0xc0);
        local_2440 = *(undefined1 (*) [32])(uVar37 + 0xe0);
        auVar15 = *(undefined1 (*) [32])(uVar37 + 0x100);
        auVar16 = *(undefined1 (*) [32])(uVar37 + 0x120);
        auVar17 = *(undefined1 (*) [32])(uVar37 + 0x140);
        fVar3 = 1.0 - fVar2;
        auVar64._4_4_ = fVar3;
        auVar64._0_4_ = fVar3;
        auVar64._8_4_ = fVar3;
        auVar64._12_4_ = fVar3;
        auVar64._16_4_ = fVar3;
        auVar64._20_4_ = fVar3;
        auVar64._24_4_ = fVar3;
        auVar64._28_4_ = fVar3;
        local_2460._0_4_ = fVar2 * *(float *)(uVar37 + 0x1c0);
        local_2460._4_4_ = fVar2 * *(float *)(uVar37 + 0x1c4);
        local_2460._8_4_ = fVar2 * *(float *)(uVar37 + 0x1c8);
        local_2460._12_4_ = fVar2 * *(float *)(uVar37 + 0x1cc);
        local_2460._16_4_ = fVar2 * *(float *)(uVar37 + 0x1d0);
        local_2460._20_4_ = fVar2 * *(float *)(uVar37 + 0x1d4);
        local_2460._24_4_ = fVar2 * *(float *)(uVar37 + 0x1d8);
        local_2460._28_4_ = 0;
        auVar9._4_4_ = fStack_251c * auVar15._4_4_;
        auVar9._0_4_ = local_2520 * auVar15._0_4_;
        auVar9._8_4_ = fStack_2518 * auVar15._8_4_;
        auVar9._12_4_ = fStack_2514 * auVar15._12_4_;
        auVar9._16_4_ = fStack_2510 * auVar15._16_4_;
        auVar9._20_4_ = fStack_250c * auVar15._20_4_;
        auVar9._24_4_ = fStack_2508 * auVar15._24_4_;
        auVar9._28_4_ = 0;
        auVar49._0_4_ = local_2520 * auVar16._0_4_;
        auVar49._4_4_ = fStack_251c * auVar16._4_4_;
        auVar49._8_4_ = fStack_2518 * auVar16._8_4_;
        auVar49._12_4_ = fStack_2514 * auVar16._12_4_;
        auVar49._16_4_ = fStack_2510 * auVar16._16_4_;
        auVar49._20_4_ = fStack_250c * auVar16._20_4_;
        auVar49._24_4_ = fStack_2508 * auVar16._24_4_;
        auVar49._28_4_ = 0;
        auVar27._4_4_ = uStack_24fc;
        auVar27._0_4_ = local_2500;
        auVar27._8_4_ = uStack_24f8;
        auVar27._12_4_ = uStack_24f4;
        auVar27._16_4_ = uStack_24f0;
        auVar27._20_4_ = uStack_24ec;
        auVar27._24_4_ = uStack_24e8;
        auVar27._28_4_ = uStack_24e4;
        auVar42 = vfmadd231ps_fma(auVar9,auVar27,local_2420);
        auVar45 = vfmadd231ps_fma(auVar49,auVar27,local_23e0);
        auVar28._4_4_ = uStack_24dc;
        auVar28._0_4_ = local_24e0;
        auVar28._8_4_ = uStack_24d8;
        auVar28._12_4_ = uStack_24d4;
        auVar28._16_4_ = uStack_24d0;
        auVar28._20_4_ = uStack_24cc;
        auVar28._24_4_ = uStack_24c8;
        auVar28._28_4_ = uStack_24c4;
        auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar28,local_2400);
        auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar28,local_23c0);
        auVar61._8_4_ = 0x7fffffff;
        auVar61._0_8_ = 0x7fffffff7fffffff;
        auVar61._12_4_ = 0x7fffffff;
        auVar61._16_4_ = 0x7fffffff;
        auVar61._20_4_ = 0x7fffffff;
        auVar61._24_4_ = 0x7fffffff;
        auVar61._28_4_ = 0x7fffffff;
        auVar9 = vandps_avx(auVar61,ZEXT1632(auVar42));
        auVar54._8_4_ = 0x219392ef;
        auVar54._0_8_ = 0x219392ef219392ef;
        auVar54._12_4_ = 0x219392ef;
        auVar54._16_4_ = 0x219392ef;
        auVar54._20_4_ = 0x219392ef;
        auVar54._24_4_ = 0x219392ef;
        auVar54._28_4_ = 0x219392ef;
        auVar9 = vcmpps_avx(auVar9,auVar54,1);
        auVar10 = vblendvps_avx(ZEXT1632(auVar42),auVar54,auVar9);
        auVar9 = vandps_avx(auVar61,ZEXT1632(auVar45));
        auVar9 = vcmpps_avx(auVar9,auVar54,1);
        auVar49 = vblendvps_avx(ZEXT1632(auVar45),auVar54,auVar9);
        auVar11._4_4_ = fStack_251c * auVar17._4_4_;
        auVar11._0_4_ = local_2520 * auVar17._0_4_;
        auVar11._8_4_ = fStack_2518 * auVar17._8_4_;
        auVar11._12_4_ = fStack_2514 * auVar17._12_4_;
        auVar11._16_4_ = fStack_2510 * auVar17._16_4_;
        auVar11._20_4_ = fStack_250c * auVar17._20_4_;
        auVar11._24_4_ = fStack_2508 * auVar17._24_4_;
        auVar11._28_4_ = auVar9._28_4_;
        auVar42 = vfmadd231ps_fma(auVar11,auVar27,local_2440);
        auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar28,*pauVar1);
        auVar9 = vandps_avx(auVar61,ZEXT1632(auVar42));
        auVar11 = vcmpps_avx(auVar9,auVar54,1);
        auVar9 = vblendvps_avx(ZEXT1632(auVar42),auVar54,auVar11);
        auVar13._4_4_ = fVar2 * *(float *)(uVar37 + 0x1e4);
        auVar13._0_4_ = fVar2 * *(float *)(uVar37 + 0x1e0);
        auVar13._8_4_ = fVar2 * *(float *)(uVar37 + 0x1e8);
        auVar13._12_4_ = fVar2 * *(float *)(uVar37 + 0x1ec);
        auVar13._16_4_ = fVar2 * *(float *)(uVar37 + 0x1f0);
        auVar13._20_4_ = fVar2 * *(float *)(uVar37 + 500);
        auVar13._24_4_ = fVar2 * *(float *)(uVar37 + 0x1f8);
        auVar13._28_4_ = fStack_2504;
        auVar12 = vfmadd231ps_fma(local_2460,auVar64,ZEXT832(0) << 0x20);
        auVar18 = vfmadd231ps_fma(auVar13,auVar64,ZEXT832(0) << 0x20);
        auVar21._4_4_ = fVar2 * *(float *)(uVar37 + 0x204);
        auVar21._0_4_ = fVar2 * *(float *)(uVar37 + 0x200);
        auVar21._8_4_ = fVar2 * *(float *)(uVar37 + 0x208);
        auVar21._12_4_ = fVar2 * *(float *)(uVar37 + 0x20c);
        auVar21._16_4_ = fVar2 * *(float *)(uVar37 + 0x210);
        auVar21._20_4_ = fVar2 * *(float *)(uVar37 + 0x214);
        auVar21._24_4_ = fVar2 * *(float *)(uVar37 + 0x218);
        auVar21._28_4_ = uStack_24e4;
        auVar19 = vfmadd231ps_fma(auVar21,auVar64,ZEXT832(0) << 0x20);
        auVar50._0_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x220);
        auVar50._4_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x224);
        auVar50._8_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x228);
        auVar50._12_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x22c);
        auVar50._16_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x230);
        auVar50._20_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x234);
        auVar50._24_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x238);
        auVar50._28_4_ = fVar3 + auVar11._28_4_;
        auVar48._0_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x240);
        auVar48._4_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x244);
        auVar48._8_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x248);
        auVar48._12_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x24c);
        auVar48._16_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x250);
        auVar48._20_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x254);
        auVar48._24_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 600);
        auVar48._28_4_ = fVar3 + 0.0;
        auVar11 = vrcpps_avx(auVar10);
        auVar65._0_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x260);
        auVar65._4_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x264);
        auVar65._8_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x268);
        auVar65._12_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x26c);
        auVar65._16_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x270);
        auVar65._20_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x274);
        auVar65._24_4_ = fVar3 + fVar2 * *(float *)(uVar37 + 0x278);
        auVar65._28_4_ = fVar3 + 0.0;
        auVar13 = vrcpps_avx(auVar49);
        auVar55._8_4_ = 0x3f800000;
        auVar55._0_8_ = 0x3f8000003f800000;
        auVar55._12_4_ = 0x3f800000;
        auVar55._16_4_ = 0x3f800000;
        auVar55._20_4_ = 0x3f800000;
        auVar55._24_4_ = 0x3f800000;
        auVar55._28_4_ = 0x3f800000;
        auVar42 = vfnmadd213ps_fma(auVar10,auVar11,auVar55);
        auVar42 = vfmadd132ps_fma(ZEXT1632(auVar42),auVar11,auVar11);
        auVar45 = vfnmadd213ps_fma(auVar49,auVar13,auVar55);
        auVar45 = vfmadd132ps_fma(ZEXT1632(auVar45),auVar13,auVar13);
        auVar10 = vrcpps_avx(auVar9);
        auVar46 = vfnmadd213ps_fma(auVar9,auVar10,auVar55);
        auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar10,auVar10);
        auVar10._4_4_ = fStack_24bc;
        auVar10._0_4_ = local_24c0;
        auVar10._8_4_ = fStack_24b8;
        auVar10._12_4_ = fStack_24b4;
        auVar10._16_4_ = fStack_24b0;
        auVar10._20_4_ = fStack_24ac;
        auVar10._24_4_ = fStack_24a8;
        auVar10._28_4_ = fStack_24a4;
        auVar43 = vfmadd213ps_fma(auVar15,auVar10,*(undefined1 (*) [32])(uVar37 + 0x160));
        auVar15._4_4_ = fStack_249c;
        auVar15._0_4_ = local_24a0;
        auVar15._8_4_ = fStack_2498;
        auVar15._12_4_ = fStack_2494;
        auVar15._16_4_ = fStack_2490;
        auVar15._20_4_ = fStack_248c;
        auVar15._24_4_ = fStack_2488;
        auVar15._28_4_ = fStack_2484;
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar15,local_2420);
        auVar56 = ZEXT3264(local_25c0);
        auVar43 = vfmadd213ps_fma(auVar16,auVar10,*(undefined1 (*) [32])(uVar37 + 0x180));
        auVar47 = vfmadd213ps_fma(auVar17,auVar10,*(undefined1 (*) [32])(uVar37 + 0x1a0));
        auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar15,local_23e0);
        auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar15,local_2440);
        auVar16._4_4_ = fStack_247c;
        auVar16._0_4_ = local_2480;
        auVar16._8_4_ = fStack_2478;
        auVar16._12_4_ = fStack_2474;
        auVar16._16_4_ = fStack_2470;
        auVar16._20_4_ = fStack_246c;
        auVar16._24_4_ = fStack_2468;
        auVar16._28_4_ = fStack_2464;
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar16,local_2400);
        auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar16,local_23c0);
        auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar16,*pauVar1);
        auVar15 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar20));
        auVar53 = ZEXT3264(local_25a0);
        auVar16 = vsubps_avx(auVar50,ZEXT1632(auVar20));
        auVar17 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar43));
        auVar9 = vsubps_avx(auVar48,ZEXT1632(auVar43));
        auVar10 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar47));
        auVar49 = vsubps_avx(auVar65,ZEXT1632(auVar47));
        auVar22._4_4_ = auVar42._4_4_ * auVar15._4_4_;
        auVar22._0_4_ = auVar42._0_4_ * auVar15._0_4_;
        auVar22._8_4_ = auVar42._8_4_ * auVar15._8_4_;
        auVar22._12_4_ = auVar42._12_4_ * auVar15._12_4_;
        auVar22._16_4_ = auVar15._16_4_ * 0.0;
        auVar22._20_4_ = auVar15._20_4_ * 0.0;
        auVar22._24_4_ = auVar15._24_4_ * 0.0;
        auVar22._28_4_ = auVar15._28_4_;
        auVar23._4_4_ = auVar42._4_4_ * auVar16._4_4_;
        auVar23._0_4_ = auVar42._0_4_ * auVar16._0_4_;
        auVar23._8_4_ = auVar42._8_4_ * auVar16._8_4_;
        auVar23._12_4_ = auVar42._12_4_ * auVar16._12_4_;
        auVar23._16_4_ = auVar16._16_4_ * 0.0;
        auVar23._20_4_ = auVar16._20_4_ * 0.0;
        auVar23._24_4_ = auVar16._24_4_ * 0.0;
        auVar23._28_4_ = auVar16._28_4_;
        auVar57 = ZEXT3264(local_25e0);
        auVar24._4_4_ = auVar45._4_4_ * auVar17._4_4_;
        auVar24._0_4_ = auVar45._0_4_ * auVar17._0_4_;
        auVar24._8_4_ = auVar45._8_4_ * auVar17._8_4_;
        auVar24._12_4_ = auVar45._12_4_ * auVar17._12_4_;
        auVar24._16_4_ = auVar17._16_4_ * 0.0;
        auVar24._20_4_ = auVar17._20_4_ * 0.0;
        auVar24._24_4_ = auVar17._24_4_ * 0.0;
        auVar24._28_4_ = auVar17._28_4_;
        auVar17._4_4_ = auVar46._4_4_ * auVar10._4_4_;
        auVar17._0_4_ = auVar46._0_4_ * auVar10._0_4_;
        auVar17._8_4_ = auVar46._8_4_ * auVar10._8_4_;
        auVar17._12_4_ = auVar46._12_4_ * auVar10._12_4_;
        auVar17._16_4_ = auVar10._16_4_ * 0.0;
        auVar17._20_4_ = auVar10._20_4_ * 0.0;
        auVar17._24_4_ = auVar10._24_4_ * 0.0;
        auVar17._28_4_ = auVar10._28_4_;
        auVar25._4_4_ = auVar45._4_4_ * auVar9._4_4_;
        auVar25._0_4_ = auVar45._0_4_ * auVar9._0_4_;
        auVar25._8_4_ = auVar45._8_4_ * auVar9._8_4_;
        auVar25._12_4_ = auVar45._12_4_ * auVar9._12_4_;
        auVar25._16_4_ = auVar9._16_4_ * 0.0;
        auVar25._20_4_ = auVar9._20_4_ * 0.0;
        auVar25._24_4_ = auVar9._24_4_ * 0.0;
        auVar25._28_4_ = auVar9._28_4_;
        auVar59 = ZEXT3264(local_2600);
        auVar26._4_4_ = auVar46._4_4_ * auVar49._4_4_;
        auVar26._0_4_ = auVar46._0_4_ * auVar49._0_4_;
        auVar26._8_4_ = auVar46._8_4_ * auVar49._8_4_;
        auVar26._12_4_ = auVar46._12_4_ * auVar49._12_4_;
        auVar26._16_4_ = auVar49._16_4_ * 0.0;
        auVar26._20_4_ = auVar49._20_4_ * 0.0;
        auVar26._24_4_ = auVar49._24_4_ * 0.0;
        auVar26._28_4_ = auVar49._28_4_;
        auVar62 = ZEXT3264(local_2620);
        auVar15 = vpminsd_avx2(auVar24,auVar25);
        auVar16 = vpminsd_avx2(auVar17,auVar26);
        auVar15 = vmaxps_avx(auVar15,auVar16);
        auVar10 = vpminsd_avx2(auVar22,auVar23);
        auVar9 = vpmaxsd_avx2(auVar22,auVar23);
        auVar16 = vpmaxsd_avx2(auVar24,auVar25);
        auVar17 = vpmaxsd_avx2(auVar17,auVar26);
        auVar17 = vminps_avx(auVar16,auVar17);
        auVar16 = vmaxps_avx(local_25c0,auVar10);
        auVar52 = ZEXT3264(local_2580);
        local_2640 = vmaxps_avx(auVar16,auVar15);
        auVar51 = ZEXT3264(local_2560);
        auVar15 = vminps_avx(auVar41._0_32_,auVar9);
        auVar15 = vminps_avx(auVar15,auVar17);
        auVar15 = vcmpps_avx(local_2640,auVar15,2);
        auVar42 = auVar15._0_16_;
        auVar45 = auVar15._16_16_;
LAB_01684fcc:
        auVar42 = vpackssdw_avx(auVar42,auVar45);
      }
      else {
        auVar44._4_4_ = fVar2;
        auVar44._0_4_ = fVar2;
        auVar44._8_4_ = fVar2;
        auVar44._12_4_ = fVar2;
        auVar44._16_4_ = fVar2;
        auVar44._20_4_ = fVar2;
        auVar44._24_4_ = fVar2;
        auVar44._28_4_ = fVar2;
        auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + uVar39),auVar44,
                                  *(undefined1 (*) [32])(uVar37 + 0x40 + uVar39));
        auVar42 = vfmadd213ps_fma(ZEXT1632(auVar42),auVar51._0_32_,auVar57._0_32_);
        auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + uVar38),auVar44,
                                  *(undefined1 (*) [32])(uVar37 + 0x40 + uVar38));
        auVar45 = vfmadd213ps_fma(ZEXT1632(auVar45),auVar52._0_32_,auVar59._0_32_);
        auVar15 = vpmaxsd_avx2(ZEXT1632(auVar42),ZEXT1632(auVar45));
        auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + uVar35),auVar44,
                                  *(undefined1 (*) [32])(uVar37 + 0x40 + uVar35));
        auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + (uVar39 ^ 0x20)),auVar44,
                                  *(undefined1 (*) [32])(uVar37 + 0x40 + (uVar39 ^ 0x20)));
        auVar45 = vfmadd213ps_fma(ZEXT1632(auVar45),auVar51._0_32_,auVar57._0_32_);
        auVar46 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + (uVar38 ^ 0x20)),auVar44,
                                  *(undefined1 (*) [32])(uVar37 + 0x40 + (uVar38 ^ 0x20)));
        auVar46 = vfmadd213ps_fma(ZEXT1632(auVar46),auVar52._0_32_,auVar59._0_32_);
        auVar17 = vpminsd_avx2(ZEXT1632(auVar45),ZEXT1632(auVar46));
        auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar37 + 0x100 + (uVar35 ^ 0x20)),auVar44,
                                  *(undefined1 (*) [32])(uVar37 + 0x40 + (uVar35 ^ 0x20)));
        auVar42 = vfmadd213ps_fma(ZEXT1632(auVar42),auVar53._0_32_,auVar62._0_32_);
        auVar45 = vfmadd213ps_fma(ZEXT1632(auVar45),auVar53._0_32_,auVar62._0_32_);
        auVar16 = vpmaxsd_avx2(ZEXT1632(auVar42),auVar56._0_32_);
        local_2640 = vpmaxsd_avx2(auVar15,auVar16);
        auVar15 = vpminsd_avx2(ZEXT1632(auVar45),auVar41._0_32_);
        auVar15 = vpminsd_avx2(auVar17,auVar15);
        auVar15 = vcmpps_avx(local_2640,auVar15,2);
        if (uVar29 == 6) {
          auVar16 = vcmpps_avx(*(undefined1 (*) [32])(uVar37 + 0x1c0),auVar44,2);
          auVar17 = vcmpps_avx(auVar44,*(undefined1 (*) [32])(uVar37 + 0x1e0),1);
          auVar16 = vandps_avx(auVar16,auVar17);
          auVar15 = vandps_avx(auVar16,auVar15);
          auVar42 = auVar15._0_16_;
          auVar45 = auVar15._16_16_;
          goto LAB_01684fcc;
        }
        auVar42 = vpackssdw_avx(auVar15._0_16_,auVar15._16_16_);
      }
      auVar42 = vpsllw_avx(auVar42,0xf);
      if ((((((((auVar42 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar42 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar42 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar42 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar42 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar42 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar42[0xf])
      goto LAB_01684b5a;
      auVar42 = vpacksswb_avx(auVar42,auVar42);
      bVar14 = SUB161(auVar42 >> 7,0) & 1 | (SUB161(auVar42 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar42 >> 0x17,0) & 1) << 2 | (SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar42 >> 0x27,0) & 1) << 4 | (SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar42 >> 0x37,0) & 1) << 6 | SUB161(auVar42 >> 0x3f,0) << 7;
      lVar34 = 0;
      for (uVar33 = (ulong)bVar14; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
        lVar34 = lVar34 + 1;
      }
      uVar33 = *(ulong *)(uVar37 + lVar34 * 8);
      uVar29 = bVar14 - 1 & (uint)bVar14;
      uVar30 = (ulong)uVar29;
      if (uVar29 != 0) {
        uVar7 = *(uint *)(local_2640 + lVar34 * 4);
        lVar34 = 0;
        for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
          lVar34 = lVar34 + 1;
        }
        uVar29 = uVar29 - 1 & uVar29;
        uVar31 = (ulong)uVar29;
        uVar30 = *(ulong *)(uVar37 + lVar34 * 8);
        uVar8 = *(uint *)(local_2640 + lVar34 * 4);
        if (uVar29 == 0) {
          if (uVar7 < uVar8) {
            *(ulong *)*pauVar40 = uVar30;
            *(uint *)(*pauVar40 + 8) = uVar8;
            pauVar40 = pauVar40 + 1;
          }
          else {
            *(ulong *)*pauVar40 = uVar33;
            *(uint *)(*pauVar40 + 8) = uVar7;
            uVar33 = uVar30;
            pauVar40 = pauVar40 + 1;
          }
        }
        else {
          auVar42._8_8_ = 0;
          auVar42._0_8_ = uVar33;
          auVar42 = vpunpcklqdq_avx(auVar42,ZEXT416(uVar7));
          auVar45._8_8_ = 0;
          auVar45._0_8_ = uVar30;
          auVar45 = vpunpcklqdq_avx(auVar45,ZEXT416(uVar8));
          lVar34 = 0;
          for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
            lVar34 = lVar34 + 1;
          }
          uVar29 = uVar29 - 1 & uVar29;
          uVar33 = (ulong)uVar29;
          auVar46._8_8_ = 0;
          auVar46._0_8_ = *(ulong *)(uVar37 + lVar34 * 8);
          auVar43 = vpunpcklqdq_avx(auVar46,ZEXT416(*(uint *)(local_2640 + lVar34 * 4)));
          auVar46 = vpcmpgtd_avx(auVar45,auVar42);
          if (uVar29 == 0) {
            auVar47 = vpshufd_avx(auVar46,0xaa);
            auVar46 = vblendvps_avx(auVar45,auVar42,auVar47);
            auVar42 = vblendvps_avx(auVar42,auVar45,auVar47);
            auVar45 = vpcmpgtd_avx(auVar43,auVar46);
            auVar47 = vpshufd_avx(auVar45,0xaa);
            auVar45 = vblendvps_avx(auVar43,auVar46,auVar47);
            auVar46 = vblendvps_avx(auVar46,auVar43,auVar47);
            auVar43 = vpcmpgtd_avx(auVar46,auVar42);
            auVar47 = vpshufd_avx(auVar43,0xaa);
            auVar43 = vblendvps_avx(auVar46,auVar42,auVar47);
            auVar42 = vblendvps_avx(auVar42,auVar46,auVar47);
            *pauVar40 = auVar42;
            pauVar40[1] = auVar43;
            uVar33 = auVar45._0_8_;
            pauVar40 = pauVar40 + 2;
          }
          else {
            lVar34 = 0;
            for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
              lVar34 = lVar34 + 1;
            }
            uVar29 = uVar29 - 1 & uVar29;
            uVar33 = (ulong)uVar29;
            auVar47._8_8_ = 0;
            auVar47._0_8_ = *(ulong *)(uVar37 + lVar34 * 8);
            auVar47 = vpunpcklqdq_avx(auVar47,ZEXT416(*(uint *)(local_2640 + lVar34 * 4)));
            if (uVar29 == 0) {
              auVar12 = vpshufd_avx(auVar46,0xaa);
              auVar46 = vblendvps_avx(auVar45,auVar42,auVar12);
              auVar42 = vblendvps_avx(auVar42,auVar45,auVar12);
              auVar45 = vpcmpgtd_avx(auVar47,auVar43);
              auVar12 = vpshufd_avx(auVar45,0xaa);
              auVar45 = vblendvps_avx(auVar47,auVar43,auVar12);
              auVar43 = vblendvps_avx(auVar43,auVar47,auVar12);
              auVar47 = vpcmpgtd_avx(auVar43,auVar42);
              auVar12 = vpshufd_avx(auVar47,0xaa);
              auVar47 = vblendvps_avx(auVar43,auVar42,auVar12);
              auVar42 = vblendvps_avx(auVar42,auVar43,auVar12);
              auVar43 = vpcmpgtd_avx(auVar45,auVar46);
              auVar12 = vpshufd_avx(auVar43,0xaa);
              auVar43 = vblendvps_avx(auVar45,auVar46,auVar12);
              auVar45 = vblendvps_avx(auVar46,auVar45,auVar12);
              auVar46 = vpcmpgtd_avx(auVar47,auVar45);
              auVar12 = vpshufd_avx(auVar46,0xaa);
              auVar46 = vblendvps_avx(auVar47,auVar45,auVar12);
              auVar45 = vblendvps_avx(auVar45,auVar47,auVar12);
              *pauVar40 = auVar42;
              pauVar40[1] = auVar45;
              pauVar40[2] = auVar46;
              uVar33 = auVar43._0_8_;
              pauVar40 = pauVar40 + 3;
            }
            else {
              *pauVar40 = auVar42;
              pauVar40[1] = auVar45;
              pauVar40[2] = auVar43;
              pauVar32 = pauVar40 + 3;
              pauVar40[3] = auVar47;
              do {
                lVar34 = 0;
                for (uVar30 = uVar33; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000)
                {
                  lVar34 = lVar34 + 1;
                }
                auVar43._8_8_ = 0;
                auVar43._0_8_ = *(ulong *)(uVar37 + lVar34 * 8);
                auVar42 = vpunpcklqdq_avx(auVar43,ZEXT416(*(uint *)(local_2640 + lVar34 * 4)));
                pauVar32[1] = auVar42;
                pauVar32 = pauVar32 + 1;
                uVar33 = uVar33 - 1 & uVar33;
              } while (uVar33 != 0);
              lVar34 = 0;
              while (pauVar32 != pauVar40) {
                auVar42 = pauVar40[1];
                uVar29 = vextractps_avx(auVar42,2);
                for (lVar36 = 0x10;
                    (lVar34 != lVar36 && (*(uint *)(pauVar40[-1] + lVar36 + 8) < uVar29));
                    lVar36 = lVar36 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar40 + lVar36) =
                       *(undefined1 (*) [16])(pauVar40[-1] + lVar36);
                }
                *(undefined1 (*) [16])(*pauVar40 + lVar36) = auVar42;
                lVar34 = lVar34 + -0x10;
                pauVar40 = pauVar40 + 1;
              }
              auVar51 = ZEXT3264(local_2560);
              auVar52 = ZEXT3264(local_2580);
              auVar53 = ZEXT3264(local_25a0);
              auVar56 = ZEXT3264(local_25c0);
              auVar57 = ZEXT3264(local_25e0);
              auVar59 = ZEXT3264(local_2600);
              auVar62 = ZEXT3264(local_2620);
              uVar33 = *(ulong *)*pauVar32;
              pauVar40 = pauVar32;
            }
          }
        }
      }
    }
    (**(code **)((long)This->leafIntersector +
                (ulong)*(byte *)(uVar33 & 0xfffffffffffffff0) * 0x40 + 0x10))(pre,ray,k,context);
    auVar62 = ZEXT3264(local_2620);
    auVar59 = ZEXT3264(local_2600);
    auVar57 = ZEXT3264(local_25e0);
    auVar56 = ZEXT3264(local_25c0);
    auVar53 = ZEXT3264(local_25a0);
    auVar52 = ZEXT3264(local_2580);
    auVar51 = ZEXT3264(local_2560);
    uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar41 = ZEXT3264(CONCAT428(uVar6,CONCAT424(uVar6,CONCAT420(uVar6,CONCAT416(uVar6,CONCAT412(
                                                  uVar6,CONCAT48(uVar6,CONCAT44(uVar6,uVar6))))))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }